

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::
     ReadPackedPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
               (CodedInputStream *input,RepeatedField<unsigned_int> *values)

{
  byte bVar1;
  uint8 *puVar2;
  byte *pbVar3;
  Limit limit;
  ulong uVar4;
  int iVar5;
  uint32 first_byte_or_zero;
  
  puVar2 = input->buffer_;
  if ((puVar2 < input->buffer_end_) && (iVar5 = (int)(char)*puVar2, -1 < (char)*puVar2)) {
    input->buffer_ = puVar2 + 1;
  }
  else {
    iVar5 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
    if (iVar5 < 0) {
      return false;
    }
  }
  limit = io::CodedInputStream::PushLimit(input,iVar5);
  do {
    iVar5 = io::CodedInputStream::BytesUntilLimit(input);
    if (iVar5 < 1) {
      io::CodedInputStream::PopLimit(input,limit);
      return true;
    }
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar4 = (ulong)bVar1;
      first_byte_or_zero = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_0042a208;
      input->buffer_ = pbVar3 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_0042a208:
      uVar4 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
      if ((long)uVar4 < 0) {
        return false;
      }
    }
    iVar5 = values->current_size_;
    if (iVar5 == values->total_size_) {
      RepeatedField<unsigned_int>::Reserve(values,iVar5 + 1);
      iVar5 = values->current_size_;
    }
    values->current_size_ = iVar5 + 1;
    values->rep_->elements[iVar5] = (uint)uVar4;
  } while( true );
}

Assistant:

inline bool WireFormatLite::ReadPackedPrimitive(io::CodedInputStream* input,
                                                RepeatedField<CType>* values) {
  int length;
  if (!input->ReadVarintSizeAsInt(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    CType value;
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->Add(value);
  }
  input->PopLimit(limit);
  return true;
}